

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::OpenOutputFile
          (cmCTest *this,string *path,string *name,cmGeneratedFileStream *stream,
          bool cm_zlib_compress)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_598 [32];
  undefined1 local_578 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  string filename;
  undefined1 local_3a0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string testingDir;
  bool cm_zlib_compress_local;
  cmGeneratedFileStream *stream_local;
  string *name_local;
  string *path_local;
  cmCTest *this_local;
  
  testingDir.field_2._M_local_buf[0xf] = cm_zlib_compress;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &this->BinaryDir,"/Testing");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_78,"/",path);
    std::__cxx11::string::operator+=((string *)local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar4);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_58);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      poVar5 = std::operator<<((ostream *)local_200,"File ");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      poVar5 = std::operator<<(poVar5," is in the place of the testing directory");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x2f6,pcVar4,false);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      this_local._7_1_ = false;
      goto LAB_00535f31;
    }
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::MakeDirectory(pcVar4);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
      poVar5 = std::operator<<((ostream *)local_3a0,"Cannot create directory ");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x2fc,pcVar4,false);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
      this_local._7_1_ = false;
      goto LAB_00535f31;
    }
  }
  std::operator+(&local_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                 &local_400,name);
  std::__cxx11::string::~string((string *)&local_400);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::Open(stream,pcVar4,false,false);
  bVar2 = std::ios::operator!((ios *)((long)&(stream->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(stream->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if ((bVar2 & 1) == 0) {
    if (((testingDir.field_2._M_local_buf[0xf] & 1U) != 0) && ((this->CompressXMLFiles & 1U) != 0))
    {
      cmGeneratedFileStream::SetCompression(stream,true);
    }
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
    poVar5 = std::operator<<((ostream *)local_578,"Problem opening file: ");
    poVar5 = std::operator<<(poVar5,(string *)local_3e0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x304,pcVar4,false);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_3e0);
LAB_00535f31:
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::OpenOutputFile(const std::string& path, const std::string& name,
                             cmGeneratedFileStream& stream, bool compress)
{
  std::string testingDir = this->BinaryDir + "/Testing";
  if (!path.empty()) {
    testingDir += "/" + path;
  }
  if (cmSystemTools::FileExists(testingDir.c_str())) {
    if (!cmSystemTools::FileIsDirectory(testingDir)) {
      cmCTestLog(this, ERROR_MESSAGE, "File "
                   << testingDir << " is in the place of the testing directory"
                   << std::endl);
      return false;
    }
  } else {
    if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory " << testingDir
                                                                 << std::endl);
      return false;
    }
  }
  std::string filename = testingDir + "/" + name;
  stream.Open(filename.c_str());
  if (!stream) {
    cmCTestLog(this, ERROR_MESSAGE, "Problem opening file: " << filename
                                                             << std::endl);
    return false;
  }
  if (compress) {
    if (this->CompressXMLFiles) {
      stream.SetCompression(true);
    }
  }
  return true;
}